

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void __thiscall
Js::JavascriptOperators::OP_LoadUndefinedToElementScoped
          (JavascriptOperators *this,FrameDisplay *pScope,PropertyId propertyId,Var defaultInstance,
          ScriptContext *scriptContext)

{
  undefined1 uVar1;
  ushort uVar2;
  long lVar3;
  int iVar4;
  BOOL BVar5;
  void *aValue;
  RecyclableObject *pRVar6;
  undefined4 in_register_00000014;
  uint index;
  
  lVar3 = *(long *)((long)defaultInstance + 0x3b8);
  uVar1 = *(undefined1 *)(lVar3 + 0x108);
  *(undefined1 *)(lVar3 + 0x108) = 1;
  uVar2 = *(ushort *)(this + 2);
  if (uVar2 != 0) {
    index = 0;
    do {
      aValue = FrameDisplay::GetItem((FrameDisplay *)this,index);
      pRVar6 = VarTo<Js::RecyclableObject>(aValue);
      if (pRVar6 != (RecyclableObject *)0x0) {
        iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x1c])(pRVar6,(ulong)pScope & 0xffffffff);
        if (iVar4 != 0) goto LAB_00abadea;
      }
      index = index + 1;
    } while (uVar2 != index);
  }
  BVar5 = HasOwnPropertyNoHostObject
                    ((Var)CONCAT44(in_register_00000014,propertyId),(PropertyId)pScope);
  if (BVar5 == 0) {
    OP_InitPropertyScoped
              ((FrameDisplay *)this,(PropertyId)pScope,
               *(Var *)(*(long *)((long)defaultInstance + 8) + 0x430),
               (Var)CONCAT44(in_register_00000014,propertyId),scriptContext);
  }
LAB_00abadea:
  *(undefined1 *)(lVar3 + 0x108) = uVar1;
  return;
}

Assistant:

void JavascriptOperators::OP_LoadUndefinedToElementScoped(FrameDisplay *pScope, PropertyId propertyId, Var defaultInstance, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_LdElemUndefScoped, reentrancylock, scriptContext->GetThreadContext());
        int i;
        int length = pScope->GetLength();
        Var argInstance;
        for (i = 0; i < length; i++)
        {
            argInstance = pScope->GetItem(i);
            if (JavascriptOperators::EnsureProperty(argInstance, propertyId))
            {
                return;
            }
        }

        if (!JavascriptOperators::HasOwnPropertyNoHostObject(defaultInstance, propertyId))
        {
            // CONSIDER : Consider adding pre-initialization support to activation objects.
            JavascriptOperators::OP_InitPropertyScoped(pScope, propertyId, scriptContext->GetLibrary()->GetUndefined(), defaultInstance, scriptContext);
        }
        JIT_HELPER_END(Op_LdElemUndefScoped);
    }